

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImPool<ImGuiTabBar>::Clear(ImPool<ImGuiTabBar> *this)

{
  ImGuiStoragePair *pIVar1;
  ImGuiTabBar *this_00;
  int local_14;
  int idx;
  int n;
  ImPool<ImGuiTabBar> *this_local;
  
  for (local_14 = 0; local_14 < (this->Map).Data.Size; local_14 = local_14 + 1) {
    pIVar1 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[](&(this->Map).Data,local_14);
    if ((pIVar1->field_1).val_i != -1) {
      this_00 = ImVector<ImGuiTabBar>::operator[](&this->Data,(pIVar1->field_1).val_i);
      ImGuiTabBar::~ImGuiTabBar(this_00);
    }
  }
  ImGuiStorage::Clear(&this->Map);
  ImVector<ImGuiTabBar>::clear(&this->Data);
  this->FreeIdx = 0;
  return;
}

Assistant:

void        Clear()                             { for (int n = 0; n < Map.Data.Size; n++) { int idx = Map.Data[n].val_i; if (idx != -1) Data[idx].~T(); } Map.Clear(); Data.clear(); FreeIdx = 0; }